

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.h
# Opt level: O0

void __thiscall
wasm::analysis::Stack<wasm::analysis::Inverted<wasm::analysis::ValType>_>::push
          (Stack<wasm::analysis::Inverted<wasm::analysis::ValType>_> *this,Element *elem,
          Element *element)

{
  Type *this_00;
  bool bVar1;
  bool local_29;
  Type local_28;
  Type *local_20;
  Element *element_local;
  Element *elem_local;
  Stack<wasm::analysis::Inverted<wasm::analysis::ValType>_> *this_local;
  
  local_20 = element;
  element_local = (Element *)elem;
  elem_local = (Element *)this;
  bVar1 = std::vector<wasm::Type,_std::allocator<wasm::Type>_>::empty(elem);
  this_00 = local_20;
  local_29 = false;
  if (bVar1) {
    local_28.id = (uintptr_t)
                  Inverted<wasm::analysis::ValType>::getBottom
                            ((Inverted<wasm::analysis::ValType> *)this);
    local_29 = wasm::Type::operator==(this_00,&local_28);
  }
  if (local_29 == false) {
    std::vector<wasm::Type,_std::allocator<wasm::Type>_>::emplace_back<wasm::Type>
              ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)element_local,local_20);
  }
  return;
}

Assistant:

void push(Element& elem, typename L::Element&& element) const noexcept {
    if (elem.empty() && element == lattice.getBottom()) {
      // no-op, the stack is already entirely made of bottoms.
      return;
    }
    elem.emplace_back(std::move(element));
  }